

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

void __thiscall cfd::api::json::PsbtSignatureData::~PsbtSignatureData(PsbtSignatureData *this)

{
  (this->super_JsonClassBase<cfd::api::json::PsbtSignatureData>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PsbtSignatureData_00655e60;
  std::__cxx11::string::~string((string *)&this->signature_);
  std::__cxx11::string::~string((string *)&this->pubkey_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->ignore_items)._M_t);
  return;
}

Assistant:

virtual ~PsbtSignatureData() {
    // do nothing
  }